

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_morph.cpp
# Opt level: O0

void __thiscall
AMorphedMonster::Die(AMorphedMonster *this,AActor *source,AActor *inflictor,int dmgflags)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  AActor *pAVar4;
  bool bVar5;
  TFlags<ActorFlag,_unsigned_int> local_28;
  uint local_24;
  AActor *pAStack_20;
  int dmgflags_local;
  AActor *inflictor_local;
  AActor *source_local;
  AMorphedMonster *this_local;
  
  local_24 = dmgflags;
  pAStack_20 = inflictor;
  inflictor_local = source;
  source_local = &this->super_AActor;
  AActor::Die(&this->super_AActor,source,inflictor,dmgflags);
  bVar2 = TObjPtr<AActor>::operator!=(&this->UnmorphedMe,(AActor *)0x0);
  bVar5 = false;
  if (bVar2) {
    pAVar4 = TObjPtr<AActor>::operator->(&this->UnmorphedMe);
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_28,(int)pAVar4 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_28);
    bVar5 = uVar3 != 0;
  }
  if (bVar5) {
    iVar1 = (this->super_AActor).health;
    pAVar4 = TObjPtr<AActor>::operator->(&this->UnmorphedMe);
    pAVar4->health = iVar1;
    pAVar4 = TObjPtr<AActor>::operator->(&this->UnmorphedMe);
    (*(pAVar4->super_DThinker).super_DObject._vptr_DObject[0xf])
              (pAVar4,inflictor_local,pAStack_20,(ulong)local_24);
  }
  return;
}

Assistant:

void AMorphedMonster::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	// Dead things don't unmorph
//	flags3 |= MF3_STAYMORPHED;
	// [MH]
	// But they can now, so that line above has been
	// moved into P_MorphedDeath() and is now set by
	// that function if and only if it is needed.
	Super::Die (source, inflictor, dmgflags);
	if (UnmorphedMe != NULL && (UnmorphedMe->flags & MF_UNMORPHED))
	{
		UnmorphedMe->health = health;
		UnmorphedMe->Die (source, inflictor, dmgflags);
	}
}